

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_MeshInterface.cpp
# Opt level: O2

bool __thiscall
Opcode::MeshInterface::RemapClient(MeshInterface *this,udword nb_indices,udword *permutation)

{
  ulong uVar1;
  udword uVar2;
  uint uVar3;
  IndexedTriangle *pIVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  
  bVar9 = nb_indices != 0;
  bVar10 = this->mNbTris == nb_indices;
  if (bVar10 && (permutation != (udword *)0x0 && bVar9)) {
    uVar1 = (ulong)nb_indices * 0xc + 8;
    pvVar5 = operator_new__(uVar1);
    uVar2 = this->mTriStride;
    pIVar4 = this->mTris;
    uVar6 = 0;
    for (lVar8 = 0; (ulong)nb_indices * 0xc - lVar8 != 0; lVar8 = lVar8 + 0xc) {
      *(undefined4 *)((long)pvVar5 + lVar8 + 0x10) =
           *(undefined4 *)((long)pIVar4->mVRef + (ulong)uVar6 + 8);
      *(undefined8 *)((long)pvVar5 + lVar8 + 8) =
           *(undefined8 *)((long)pIVar4->mVRef + (ulong)uVar6);
      uVar6 = uVar6 + uVar2;
    }
    uVar6 = 0;
    for (uVar7 = 0; uVar7 < nb_indices; uVar7 = uVar7 + 1) {
      pIVar4 = this->mTris;
      uVar3 = permutation[uVar7];
      *(undefined4 *)((long)pIVar4->mVRef + (ulong)uVar6 + 8) =
           *(undefined4 *)((long)pvVar5 + (ulong)uVar3 * 0xc + 0x10);
      *(undefined8 *)((long)pIVar4->mVRef + (ulong)uVar6) =
           *(undefined8 *)((long)pvVar5 + (ulong)uVar3 * 0xc + 8);
      nb_indices = this->mNbTris;
      uVar6 = uVar6 + uVar2;
    }
    operator_delete__(pvVar5,uVar1);
  }
  return bVar10 && (permutation != (udword *)0x0 && bVar9);
}

Assistant:

bool MeshInterface::RemapClient(udword nb_indices, const udword* permutation) const
{
	// Checkings
	if(!nb_indices || !permutation)	return false;
	if(nb_indices!=mNbTris)			return false;

#ifdef OPC_USE_CALLBACKS
	// We can't really do that using callbacks
	return false;
#else
	IndexedTriangle* Tmp = new IndexedTriangle[mNbTris];
	CHECKALLOC(Tmp);

	#ifdef OPC_USE_STRIDE
	udword Stride = mTriStride;
	#else
	udword Stride = sizeof(IndexedTriangle);
	#endif

	for(udword i=0;i<mNbTris;i++)
	{
		const IndexedTriangle* T = (const IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		Tmp[i] = *T;
	}

	for(udword i=0;i<mNbTris;i++)
	{
		IndexedTriangle* T = (IndexedTriangle*)(((ubyte*)mTris) + i * Stride);
		*T = Tmp[permutation[i]];
	}

	DELETEARRAY(Tmp);
#endif
	return true;
}